

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O1

string * __thiscall
mocker::ir::Builder::getTypeIdentifier_abi_cxx11_
          (string *__return_storage_ptr__,Builder *this,shared_ptr<mocker::ast::Type> *type)

{
  element_type *peVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  bool bVar6;
  
  peVar1 = (type->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    lVar4 = 0;
  }
  else {
    lVar4 = __dynamic_cast(peVar1,&ast::Type::typeinfo,&ast::BuiltinType::typeinfo,0);
  }
  if (lVar4 == 0) {
    p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    lVar4 = 0;
  }
  else {
    p_Var5 = (type->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      }
    }
  }
  if (lVar4 != 0) {
    if (*(int *)(lVar4 + 0x18) != 2) {
      __assert_fail("p->type == ast::BuiltinType::String",
                    "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/ir_builder/builder.cpp"
                    ,0x3cf,
                    "std::string mocker::ir::Builder::getTypeIdentifier(const std::shared_ptr<ast::Type> &) const"
                   );
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"string","");
  }
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
  }
  if (lVar4 == 0) {
    peVar1 = (type->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (peVar1 == (element_type *)0x0) {
      lVar4 = 0;
    }
    else {
      lVar4 = __dynamic_cast(peVar1,&ast::Type::typeinfo,&ast::UserDefinedType::typeinfo,0);
    }
    if (lVar4 == 0) {
      lVar4 = 0;
      p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      p_Var5 = (type->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
               ._M_pi;
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
        }
      }
    }
    if (lVar4 != 0) {
      lVar2 = *(long *)(lVar4 + 0x18);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      lVar3 = *(long *)(lVar2 + 0x18);
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,lVar3,*(long *)(lVar2 + 0x20) + lVar3);
    }
    if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
    }
    if (lVar4 == 0) {
      peVar1 = (type->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (peVar1 == (element_type *)0x0) {
        bVar6 = false;
      }
      else {
        lVar4 = __dynamic_cast(peVar1,&ast::Type::typeinfo,&ast::ArrayType::typeinfo,0);
        bVar6 = lVar4 != 0;
      }
      if (bVar6) {
        p_Var5 = (type->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
        if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
          }
        }
      }
      else {
        p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      if (bVar6) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)__return_storage_ptr__,"_array_","");
      }
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
      }
      if (!bVar6) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/ir_builder/builder.cpp"
                      ,0x3d8,
                      "std::string mocker::ir::Builder::getTypeIdentifier(const std::shared_ptr<ast::Type> &) const"
                     );
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
Builder::getTypeIdentifier(const std::shared_ptr<ast::Type> &type) const {
  if (auto p = std::dynamic_pointer_cast<ast::BuiltinType>(type)) {
    assert(p->type == ast::BuiltinType::String);
    return "string";
  }
  if (auto p = std::dynamic_pointer_cast<ast::UserDefinedType>(type)) {
    return p->name->val;
  }
  if (auto p = std::dynamic_pointer_cast<ast::ArrayType>(type)) {
    return "_array_";
  }
  assert(false);
}